

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

confirm * __thiscall
lest::for_test<lest::confirm>(lest *this,tests *specification,texts *in,confirm *perform,int n)

{
  bool bVar1;
  uint uVar2;
  confirm *perform_00;
  fd_set *__exceptfds;
  fd_set *__writefds;
  undefined4 in_register_00000084;
  test local_c0;
  undefined1 local_88 [56];
  reference local_50;
  test *testing;
  test *local_40;
  __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_> local_38;
  iterator pos;
  int i;
  int n_local;
  confirm *perform_local;
  texts *in_local;
  tests *specification_local;
  
  pos._M_current._4_4_ = (int)perform;
  pos._M_current._0_4_ = 0;
  do {
    uVar2 = indefinite(pos._M_current._4_4_);
    __exceptfds = (fd_set *)(ulong)uVar2;
    if (uVar2 == 0 && pos._M_current._4_4_ <= (int)pos._M_current) {
      return (confirm *)in;
    }
    local_40 = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::begin
                                 ((vector<lest::test,_std::allocator<lest::test>_> *)this);
    local_38._M_current = local_40;
    while( true ) {
      testing = (test *)std::vector<lest::test,_std::allocator<lest::test>_>::end
                                  ((vector<lest::test,_std::allocator<lest::test>_> *)this);
      bVar1 = __gnu_cxx::operator!=
                        (&local_38,
                         (__normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                          *)&testing);
      if (!bVar1) break;
      local_50 = __gnu_cxx::
                 __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>
                 ::operator*(&local_38);
      std::__cxx11::string::string((string *)(local_88 + 0x18),(string *)local_50);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_88,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)specification);
      uVar2 = select((int)local_88 + 0x18,(fd_set *)local_88,__writefds,__exceptfds,
                     (timeval *)CONCAT44(in_register_00000084,n));
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_88);
      std::__cxx11::string::~string((string *)(local_88 + 0x18));
      if ((uVar2 & 1) != 0) {
        test::test(&local_c0,local_50);
        perform_00 = confirm::operator()((confirm *)in,&local_c0);
        bVar1 = abort<lest::confirm>(perform_00);
        test::~test(&local_c0);
        if (bVar1) {
          return (confirm *)in;
        }
      }
      __gnu_cxx::
      __normal_iterator<lest::test_*,_std::vector<lest::test,_std::allocator<lest::test>_>_>::
      operator++(&local_38);
    }
    pos._M_current._0_4_ = (int)pos._M_current + 1;
  } while( true );
}

Assistant:

Action & for_test( tests specification, texts in, Action & perform, int n = 1 )
{
    for ( int i = 0; indefinite( n ) || i < n; ++i )
    {
        for ( tests::iterator pos = specification.begin(); pos != specification.end() ; ++pos )
        {
            test & testing = *pos;

            if ( select( testing.name, in ) )
                if ( abort( perform( testing ) ) )
                    return perform;
        }
    }
    return perform;
}